

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSpriteAmiga __thiscall DataSourceAmiga::get_ground_sprite(DataSourceAmiga *this,size_t index)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  PBuffer *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSpriteAmiga PVar4;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 local_68 [30];
  uint8_t compressed;
  uint8_t filled;
  shared_ptr<Buffer> local_40;
  undefined1 local_30 [8];
  PBuffer data;
  size_t index_local;
  DataSourceAmiga *this_local;
  PSpriteAmiga *sprite;
  
  std::shared_ptr<Buffer>::shared_ptr(&local_40,(shared_ptr<Buffer> *)(index + 0x58));
  get_data_from_catalog((DataSourceAmiga *)local_30,index,4,in_RDX);
  std::shared_ptr<Buffer>::~shared_ptr(&local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    local_68[0x17] = Buffer::pop<unsigned_char>(peVar2);
    peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    local_68[0x16] = Buffer::pop<unsigned_char>(peVar2);
    local_68[0x15] = 0;
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30);
    Buffer::pop_tail((Buffer *)local_68);
    decode_planned_sprite
              (this,(PBuffer *)index,(size_t)local_68,4,'\x15',local_68[0x16],
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff4c,(uint)local_68[0x17]),true);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_68);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      SpriteAmiga::set_delta(peVar3,1,0);
      peVar3 = std::
               __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      SpriteAmiga::set_offset(peVar3,0,0);
    }
    local_68[0x15] = 1;
  }
  else {
    std::shared_ptr<DataSourceAmiga::SpriteAmiga>::shared_ptr
              ((shared_ptr<DataSourceAmiga::SpriteAmiga> *)this,(nullptr_t)0x0);
  }
  local_68._24_4_ = 1;
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_30);
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::get_ground_sprite(size_t index) {
  PBuffer data = get_data_from_catalog(4, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  uint8_t filled = data->pop<uint8_t>();
  uint8_t compressed = data->pop<uint8_t>();

  PSpriteAmiga sprite = decode_planned_sprite(data->pop_tail(), 4, 21,
                                              compressed, filled, palette);

  if (sprite) {
    sprite->set_delta(1, 0);
    sprite->set_offset(0, 0);
  }

  return sprite;
}